

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# heavylight2_test.cpp
# Opt level: O0

void __thiscall HLD_Preprocessing_Test::HLD_Preprocessing_Test(HLD_Preprocessing_Test *this)

{
  HLD_Preprocessing_Test *this_local;
  
  testing::Test::Test(&this->super_Test);
  (this->super_Test)._vptr_Test = (_func_int **)&PTR__HLD_Preprocessing_Test_001b9ff8;
  return;
}

Assistant:

TEST(HLD, Preprocessing) {
	int n = 100;
	rep(i, 0, 100) {
		gen(n);
		initHLD();
		rep(i, 1, n)
			EXPECT_TRUE(top[i] == i || top[i] == top[par[i]]);
	}
}